

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cpp
# Opt level: O2

int __thiscall
VehicleState::clone(VehicleState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  Point *pPVar2;
  undefined8 uVar3;
  
  std::make_shared<VehicleState>();
  uVar1 = *(undefined8 *)__fn;
  pPVar2 = this->p;
  pPVar2->id = (int)uVar1;
  pPVar2->x = (int)((ulong)uVar1 >> 0x20);
  pPVar2->y = *(int *)(__fn + 8);
  uVar1 = *(undefined8 *)(__fn + 0x10);
  uVar3 = *(undefined8 *)(__fn + 0x18);
  pPVar2->ready_time = (int)uVar1;
  pPVar2->due_date = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&pPVar2->service_time = uVar3;
  return (int)this;
}

Assistant:

std::shared_ptr<VehicleState> VehicleState::clone()
const {
	auto vs = std::make_shared<VehicleState>();
	vs->p = this->p;
	
	vs->current_cargo = this->current_cargo;
	vs->current_time = this->current_time;
	vs->current_distance = this->current_distance;
	return vs;
}